

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# issue.cpp
# Opt level: O0

AnyCellmlElementPtr __thiscall libcellml::Issue::item(Issue *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  AnyCellmlElementPtr AVar1;
  Issue *this_local;
  
  std::shared_ptr<libcellml::AnyCellmlElement>::shared_ptr
            ((shared_ptr<libcellml::AnyCellmlElement> *)this,
             (shared_ptr<libcellml::AnyCellmlElement> *)(*(long *)(in_RSI + 8) + 0x28));
  AVar1.super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  AVar1.super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (AnyCellmlElementPtr)
         AVar1.super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

AnyCellmlElementPtr Issue::item() const
{
    return mPimpl->mItem;
}